

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O3

void print_pkt(packet_t *pkt)

{
  ushort uVar1;
  uint uVar2;
  eth_t *peVar3;
  undefined8 in_RAX;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  map_int_t *pmVar7;
  double in_XMM0_Qa;
  undefined4 uVar9;
  undefined8 uVar8;
  
  if (pkt == (packet_t *)0x0) {
    _log(in_XMM0_Qa);
    return;
  }
  puts("--------------------------------------------------");
  printf("[PACKET] len: %-5d offset: %-5d payload: %-5d\n\n",(ulong)(uint)pkt->len,
         (ulong)(uint)pkt->offset,(ulong)(uint)pkt->payload);
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  if (0 < pkt->len) {
    uVar6 = 0;
    do {
      printf(" %02X",(ulong)pkt->data[uVar6]);
      uVar6 = uVar6 + 1;
      if ((uVar6 & 0xf) == 0) {
        putchar(10);
      }
      uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
    } while ((long)uVar6 < (long)pkt->len);
  }
  puts("\n");
  printf("iface\t\t: %s -> %s\n",&pkt->iface,(pkt->iface).out);
  pcVar4 = map_int_get_k((uint)pkt->state,m_state);
  printf("state\t\t: %s\n",pcVar4);
  if (pkt->eth_type != 0) {
    printf("ether type\t: 0x%04x\n");
    peVar3 = pkt->eth;
    uVar8 = CONCAT44(uVar9,(uint)peVar3->src[5]);
    printf("src mac\t\t: %02X:%02X:%02X:%02X:%02X:%02X\n",(ulong)peVar3->src[0],
           (ulong)peVar3->src[1],(ulong)peVar3->src[2],(ulong)peVar3->src[3],(ulong)peVar3->src[4],
           uVar8);
    peVar3 = pkt->eth;
    printf("dst mac\t\t: %02X:%02X:%02X:%02X:%02X:%02X\n",(ulong)peVar3->dst[0],
           (ulong)peVar3->dst[1],(ulong)peVar3->dst[2],(ulong)peVar3->dst[3],(ulong)peVar3->dst[4],
           CONCAT44((int)((ulong)uVar8 >> 0x20),(uint)peVar3->dst[5]));
    if (pkt->eth_type == 0x800) {
      uVar1 = pkt->ip->frag;
      printf("IP frag\t\t: %d\n",(ulong)(ushort)((uVar1 & 0xff1f) << 8 | uVar1 >> 8));
      uVar2 = pkt->ip->src;
      printf("src ip\t\t: %u.%u.%u.%u\n",(ulong)(uVar2 & 0xff),
             (ulong)(((uVar2 & 0xff00) << 8) >> 0x10),(ulong)((uVar2 & 0xff0000) >> 0x10),
             (ulong)(uVar2 >> 0x18));
      uVar2 = pkt->ip->dst;
      printf("dst ip\t\t: %u.%u.%u.%u\n",(ulong)(uVar2 & 0xff),
             (ulong)(((uVar2 & 0xff00) << 8) >> 0x10),(ulong)((uVar2 & 0xff0000) >> 0x10),
             (ulong)(uVar2 >> 0x18));
    }
  }
  if (pkt->ip_proto == '\x11') {
    puts("UDP");
    lVar5 = 0x58;
  }
  else {
    if (pkt->ip_proto != '\x06') goto LAB_00105c40;
    printf("TCP flag\t: ");
    if (m_tcp_flag[0].k != (char *)0x0) {
      pmVar7 = m_tcp_flag;
      do {
        pmVar7 = pmVar7 + 1;
        if ((pmVar7[-1].v & (uint)pkt->tcp->flag) != 0) {
          printf("[%s]");
        }
      } while (pmVar7->k != (char *)0x0);
    }
    putchar(10);
    lVar5 = 0x50;
  }
  uVar1 = **(ushort **)((pkt->iface).in + lVar5 + -0x18);
  printf("src port\t: %u\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
  uVar1 = *(ushort *)(*(long *)((pkt->iface).in + lVar5 + -0x18) + 2);
  printf("dst port\t: %u\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
LAB_00105c40:
  if (0 < pkt->payload) {
    puts("--------------------------------------------------");
    lVar5 = (long)pkt->offset;
    if (pkt->offset < pkt->len) {
      do {
        putchar((uint)pkt->data[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 < pkt->len);
    }
    putchar(10);
  }
  puts("--------------------------------------------------");
  return;
}

Assistant:

void print_pkt(packet_t *pkt)
{
	if (pkt == NULL) {
		log_err("%s pkt is null\n", __FUNCTION__);
		return;
	}

	printf("--------------------------------------------------\n");

	printf("[PACKET] len: %-5d offset: %-5d payload: %-5d\n\n", pkt->len, pkt->offset, pkt->payload);

	for (int i = 0; i < pkt->len; i++) {
		printf(" %02X", pkt->data[i]);

		if ((i + 1) % 16 == 0) {
			printf("\n");
		}
	}

	printf("\n\n");

	printf("iface		: %s -> %s\n", pkt->iface.in, pkt->iface.out);
	printf("state		: %s\n", map_int_get_k(pkt->state, m_state));

	if (pkt->eth_type) {
		printf("ether type	: 0x%04x\n", pkt->eth_type);
		printf("src mac		: "MAC_FORMAT"\n", MAC_PRINT(pkt->eth->src));
		printf("dst mac		: "MAC_FORMAT"\n", MAC_PRINT(pkt->eth->dst));
	}

	if (pkt->eth_type == ETH_IP) {
		printf("IP frag		: %d\n", IP_FRAGOFF(pkt->ip));
		printf("src ip		: "IP_FORMAT"\n", IP_PRINT(pkt->ip->src));
		printf("dst ip		: "IP_FORMAT"\n", IP_PRINT(pkt->ip->dst));
	}

	if (pkt->ip_proto == IPPROTO_TCP) {
		printf("TCP flag	: ");

		for (int i = 0; m_tcp_flag[i].k != NULL; i++) {
			if (TCP_FLAG(pkt, m_tcp_flag[i].v)) {
				printf("[%s]", m_tcp_flag[i].k);
			}
		}

		printf("\n");
		printf("src port	: %u\n", ntohs(pkt->tcp->src));
		printf("dst port	: %u\n", ntohs(pkt->tcp->dst));

	} else if (pkt->ip_proto == IPPROTO_UDP) {
		printf("UDP\n");
		printf("src port	: %u\n", ntohs(pkt->udp->src));
		printf("dst port	: %u\n", ntohs(pkt->udp->dst));
	}

	if (pkt->payload > 0) {
		printf("--------------------------------------------------\n");

		for (int i = pkt->offset; i < pkt->len; i++) {
			printf("%c", pkt->data[i]);
		}
		printf("\n");
	}

	printf("--------------------------------------------------\n");
}